

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

void __thiscall Imf_3_4::Context::Context(Context *this,char *filename,undefined8 ctxtinit)

{
  int iVar1;
  ostream *poVar2;
  ArgExc *this_00;
  InputExc *this_01;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  Context(this);
  iVar1 = exr_start_read((this->_ctxt).
                         super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,filename,ctxtinit);
  if (iVar1 == 0) {
    return;
  }
  if (iVar1 == 0xd) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar2 = std::operator<<(local_190,"Invalid or missing attribute when attempting to open \'");
    poVar2 = std::operator<<(poVar2,filename);
    std::operator<<(poVar2,"\' for read");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_190,"Unable to open \'");
  poVar2 = std::operator<<(poVar2,filename);
  std::operator<<(poVar2,"\' for read");
  this_01 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_01,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_01,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, read_mode_t)
    : Context()
{
    exr_result_t rv;

    rv = exr_start_read (_ctxt.get (), filename, &(ctxtinit._initializer));
    if (EXR_ERR_SUCCESS != rv)
    {
        if (rv == EXR_ERR_MISSING_REQ_ATTR)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Invalid or missing attribute when attempting to open '"
                << filename << "' for read");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Unable to open '" << filename << "' for read");
        }
    }
}